

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack16to1.h
# Opt level: O2

void ncnn::convolution_im2col_sgemm_transform_kernel_pack16to1_avx512
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined4 *puVar4;
  uint _w;
  ulong uVar5;
  int i;
  long lVar6;
  void *pvVar7;
  ulong uVar8;
  undefined4 *puVar9;
  ulong uVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  int p_1;
  ulong uVar14;
  Mat local_78;
  
  _w = kernel_w * kernel_h;
  uVar10 = 0;
  Mat::reshape(&local_78,_kernel,_w,inch,outch,(Allocator *)0x0);
  Mat::create(kernel_tm,_w * 0x80,inch / 0x10,(outch / 8) * -7 + outch,4,(Allocator *)0x0);
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  uVar5 = (ulong)_w;
  if ((int)_w < 1) {
    uVar5 = uVar10;
  }
  for (; (long)(uVar10 | 7) < (long)outch; uVar10 = uVar10 + 8) {
    pvVar7 = (void *)((uVar10 >> 3) * sVar2 * sVar3 + (long)pvVar1);
    for (uVar8 = 0; (long)(uVar8 | 0xf) < (long)inch; uVar8 = uVar8 + 0x10) {
      puVar4 = (undefined4 *)
               (((long)local_78.w * uVar8 + uVar10 * local_78.cstep) * local_78.elemsize +
               (long)local_78.data);
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        puVar9 = puVar4;
        for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
          puVar11 = puVar9;
          for (lVar13 = 0; lVar13 != 0x20; lVar13 = lVar13 + 4) {
            *(undefined4 *)((long)pvVar7 + lVar13) = *puVar11;
            puVar11 = (undefined4 *)((long)puVar11 + local_78.cstep * local_78.elemsize);
          }
          puVar9 = (undefined4 *)((long)puVar9 + local_78.elemsize * (long)local_78.w);
          pvVar7 = (void *)((long)pvVar7 + 0x20);
        }
        puVar4 = puVar4 + 1;
      }
    }
  }
  pvVar1 = kernel_tm->data;
  sVar2 = kernel_tm->cstep;
  sVar3 = kernel_tm->elemsize;
  puVar4 = (undefined4 *)(local_78.elemsize * local_78.cstep * uVar10 + (long)local_78.data);
  for (; (long)uVar10 < (long)outch; uVar10 = uVar10 + 1) {
    pvVar7 = (void *)((ulong)(((uint)uVar10 & 7) + ((uint)(uVar10 >> 3) & 0x1fffffff)) *
                      sVar2 * sVar3 + (long)pvVar1);
    puVar9 = puVar4;
    for (uVar8 = 0; (long)(uVar8 | 0xf) < (long)inch; uVar8 = uVar8 + 0x10) {
      puVar11 = puVar9;
      for (uVar14 = 0; uVar14 != uVar5; uVar14 = uVar14 + 1) {
        puVar12 = puVar11;
        for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 4) {
          *(undefined4 *)((long)pvVar7 + lVar6) = *puVar12;
          puVar12 = (undefined4 *)((long)puVar12 + (long)local_78.w * local_78.elemsize);
        }
        puVar11 = puVar11 + 1;
        pvVar7 = (void *)((long)pvVar7 + 0x40);
      }
      puVar9 = puVar9 + (long)local_78.w * local_78.elemsize * 4;
    }
    puVar4 = (undefined4 *)((long)puVar4 + local_78.elemsize * local_78.cstep);
  }
  if (local_78.refcount != (int *)0x0) {
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // interleave
    // src = maxk-inch-outch
    // dst = pb-pa-maxk-inch/pa-outch/pb
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    kernel_tm.create(8 * 16 * maxk, inch / 16, outch / 8 + outch % 8);

    int q = 0;
    for (; q + 7 < outch; q += 8)
    {
        float* g00 = kernel_tm.channel(q / 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    for (int j = 0; j < 8; j++)
                    {
                        const float* k00 = kernel.channel(q + j).row(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }
    for (; q < outch; q++)
    {
        const Mat k0 = kernel.channel(q);

        float* g00 = kernel_tm.channel(q / 8 + q % 8);

        for (int p = 0; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 16; i++)
                {
                    const float* k00 = k0.row(p + i);
                    g00[0] = k00[k];
                    g00++;
                }
            }
        }
    }
}